

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_example_dm<false>(cb_to_cs *c,example *ec,label *cs_ld)

{
  size_t sVar1;
  cb_class *pcVar2;
  cb_class **ppcVar3;
  long in_RSI;
  long in_RDI;
  float fVar4;
  wclass wc_1;
  cb_class *cl;
  cb_class *__end3;
  cb_class *__begin3;
  v_array<CB::cb_class> *__range3;
  wclass wc;
  uint32_t i;
  uint32_t argmin;
  float min;
  label ld;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  cb_class *local_68;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint index;
  uint32_t uVar5;
  float fVar6;
  cb_class *known_cost;
  cb_class *scorer;
  
  known_cost = *(cb_class **)(in_RSI + 0x6828);
  scorer = *(cb_class **)(in_RSI + 0x6830);
  fVar6 = 3.4028235e+38;
  uVar5 = 1;
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  v_array<COST_SENSITIVE::wclass>::clear
            ((v_array<COST_SENSITIVE::wclass> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  sVar1 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
  if (sVar1 == 0) {
LAB_002f48b5:
    for (index = 1; index <= *(uint *)(in_RDI + 8); index = index + 1) {
      fVar4 = CB_ALGS::get_cost_pred<false>
                        ((single_learner *)scorer,known_cost,(example *)CONCAT44(fVar6,uVar5),index,
                         0);
      if (fVar4 < fVar6) {
        uVar5 = index;
        fVar6 = fVar4;
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if ((*(long *)(in_RDI + 0x50) != 0) && (*(uint32_t *)(*(long *)(in_RDI + 0x50) + 4) == index))
      {
        *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
        in_stack_ffffffffffffff70 = (float)(long)*(ulong *)(in_RDI + 0x40);
        in_stack_ffffffffffffff74 = (float)*(ulong *)(in_RDI + 0x40);
        *(float *)(in_RDI + 0x38) =
             (1.0 / in_stack_ffffffffffffff74) *
             ((**(float **)(in_RDI + 0x50) - fVar4) * (**(float **)(in_RDI + 0x50) - fVar4) +
             -*(float *)(in_RDI + 0x38)) + *(float *)(in_RDI + 0x38);
        *(float *)(in_RDI + 0x48) = fVar4;
        *(undefined4 *)(in_RDI + 0x4c) = **(undefined4 **)(in_RDI + 0x50);
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  else {
    sVar1 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
    if (sVar1 == 1) {
      pcVar2 = v_array<CB::cb_class>::operator[]
                         ((v_array<CB::cb_class> *)&stack0xffffffffffffffc8,0);
      if ((pcVar2->cost != 3.4028235e+38) || (NAN(pcVar2->cost))) goto LAB_002f48b5;
    }
    ppcVar3 = v_array<CB::cb_class>::begin((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
    local_68 = *ppcVar3;
    ppcVar3 = v_array<CB::cb_class>::end((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
    pcVar2 = *ppcVar3;
    for (; local_68 != pcVar2; local_68 = local_68 + 1) {
      fVar4 = CB_ALGS::get_cost_pred<false>
                        ((single_learner *)scorer,known_cost,(example *)CONCAT44(fVar6,uVar5),
                         in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      if (fVar4 < fVar6) {
LAB_002f4b8a:
        uVar5 = local_68->action;
        fVar6 = fVar4;
      }
      else if (((fVar4 == fVar6) && (!NAN(fVar4) && !NAN(fVar6))) && (local_68->action < uVar5))
      goto LAB_002f4b8a;
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if ((*(long *)(in_RDI + 0x50) != 0) &&
         (*(uint32_t *)(*(long *)(in_RDI + 0x50) + 4) == local_68->action)) {
        *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
        in_stack_ffffffffffffff68 = (float)(long)*(ulong *)(in_RDI + 0x40);
        in_stack_ffffffffffffff6c = (float)*(ulong *)(in_RDI + 0x40);
        *(float *)(in_RDI + 0x38) =
             (1.0 / in_stack_ffffffffffffff6c) *
             ((**(float **)(in_RDI + 0x50) - fVar4) * (**(float **)(in_RDI + 0x50) - fVar4) +
             -*(float *)(in_RDI + 0x38)) + *(float *)(in_RDI + 0x38);
        *(float *)(in_RDI + 0x48) = fVar4;
        *(undefined4 *)(in_RDI + 0x4c) = **(undefined4 **)(in_RDI + 0x50);
      }
      v_array<COST_SENSITIVE::wclass>::push_back
                ((v_array<COST_SENSITIVE::wclass> *)
                 CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                 (wclass *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  *(uint32_t *)(in_RSI + 0x6850) = uVar5;
  return;
}

Assistant:

void gen_cs_example_dm(cb_to_cs& c, example& ec, COST_SENSITIVE::label& cs_ld)
{  // this implements the direct estimation method, where costs are directly specified by the learned regressor.
  CB::label ld = ec.l.cb;

  float min = FLT_MAX;
  uint32_t argmin = 1;
  // generate cost sensitive example
  cs_ld.costs.clear();
  c.pred_scores.costs.clear();

  if (ld.costs.size() == 0 ||
      (ld.costs.size() == 1 &&
          ld.costs[0].cost != FLT_MAX))  // this is a typical example where we can perform all actions
  {                                      // in this case generate cost-sensitive example with all actions
    for (uint32_t i = 1; i <= c.num_actions; i++)
    {
      COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, i, 0);
      if (wc.x < min)
      {
        min = wc.x;
        argmin = i;
      }

      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == i)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }
  else  // this is an example where we can only perform a subset of the actions
  {     // in this case generate cost-sensitive example with only allowed actions
    for (auto& cl : ld.costs)
    {
      COST_SENSITIVE::wclass wc = {0., cl.action, 0., 0.};

      // get cost prediction for this action
      wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, cl.action, 0);
      if (wc.x < min || (wc.x == min && cl.action < argmin))
      {
        min = wc.x;
        argmin = cl.action;
      }
      c.pred_scores.costs.push_back(wc);

      if (c.known_cost != nullptr && c.known_cost->action == cl.action)
      {
        c.nb_ex_regressors++;
        c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
            ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
        c.last_pred_reg = wc.x;
        c.last_correct_cost = c.known_cost->cost;
      }

      cs_ld.costs.push_back(wc);
    }
  }

  ec.pred.multiclass = argmin;
}